

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *p)

{
  FileDescriptorProto *__return_storage_ptr__;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  initializer_list<google::protobuf::io::Printer::Sub> v_02;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  initializer_list<google::protobuf::io::Printer::Sub> v_03;
  initializer_list<google::protobuf::io::Printer::Sub> v_04;
  initializer_list<google::protobuf::io::Printer::Sub> v_05;
  undefined1 auVar1 [8];
  undefined1 this_00 [8];
  bool bVar2;
  int iVar3;
  size_type __n;
  size_type sVar4;
  size_type sVar5;
  AlphaNum *pAVar6;
  reference ppDVar7;
  Options *in_R9;
  string_view sVar8;
  string_view filename;
  string_view name;
  string_view separator;
  Sub *local_1a48;
  Sub *local_1998;
  unsigned_long local_1930;
  Sub *local_18a8;
  Sub *local_1860;
  Sub *local_17b8;
  Sub *local_1788;
  Sub *local_1718;
  Sub *local_16b8;
  basic_string_view<char,_std::char_traits<char>_> local_1690;
  undefined1 local_1679;
  FileGenerator *local_1678;
  basic_string_view<char,_std::char_traits<char>_> local_1670;
  string local_1660;
  allocator<char> local_1639;
  string local_1638;
  basic_string_view<char,_std::char_traits<char>_> local_1618;
  string local_1608;
  allocator<char> local_15e1;
  string local_15e0;
  Sub *local_15c0;
  Sub local_15b8;
  Sub local_1500;
  iterator local_1448;
  size_type local_1440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1438;
  AlphaNum local_1420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_13f0;
  AlphaNum local_13e0;
  string local_13b0;
  undefined1 local_1390 [16];
  undefined1 local_1378 [8];
  NamespaceOpener ns;
  value_type local_1348;
  anon_class_16_2_4df4e3d3 local_1328;
  value_type local_1318;
  Descriptor *local_12f0;
  Descriptor *pinned;
  iterator __end5;
  iterator __begin5;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *__range5;
  basic_string_view<char,_std::char_traits<char>_> local_12a0;
  undefined1 local_1289;
  size_type local_1288;
  allocator<char> local_1279;
  string local_1278;
  allocator<char> local_1251;
  string local_1250;
  AlphaNum local_1230;
  string_view local_1200;
  AlphaNum *local_11f0;
  char *local_11e8;
  AlphaNum local_11e0;
  byte local_11aa;
  allocator<char> local_11a9;
  string local_11a8;
  allocator<char> local_1181;
  string local_1180;
  allocator<char> local_1159;
  string local_1158;
  unsigned_long local_1138;
  allocator<char> local_1129;
  string local_1128;
  char *local_1108;
  allocator<char> local_10f9;
  string local_10f8;
  Sub *local_10d8;
  Sub local_10d0;
  Sub local_1018;
  Sub local_f60;
  Sub local_ea8;
  Sub local_df0;
  Sub local_d38;
  iterator local_c80;
  size_type local_c78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c70;
  undefined1 local_c5b;
  undefined1 auStack_c58 [5];
  bool eager;
  undefined8 local_c50;
  undefined1 local_c41;
  anon_class_24_3_67b76fa3_for_cb local_c40;
  allocator<char> local_c21;
  string local_c20;
  allocator<char> local_bf9;
  string local_bf8;
  undefined8 local_bd8;
  Sub local_bd0;
  undefined1 local_b18 [184];
  iterator local_a60;
  size_type local_a58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a50;
  undefined1 local_a40 [8];
  size_t num_deps;
  CrossFileReferences refs;
  basic_string_view<char,_std::char_traits<char>_> local_9e8;
  undefined1 local_9d1;
  anon_class_24_3_7ba27a30_for_cb local_9d0;
  allocator<char> local_9b1;
  string local_9b0;
  allocator<char> local_989;
  string local_988;
  Sub *local_968;
  Sub local_960;
  Sub local_8a8;
  iterator local_7f0;
  size_type local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_7e0;
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  string desc_name;
  string file_data;
  FileDescriptorProto file_proto;
  basic_string_view<char,_std::char_traits<char>_> local_680;
  pointer local_668;
  char *pcStack_660;
  undefined8 local_650;
  undefined8 local_648;
  allocator<google::protobuf::io::Printer::Sub> local_63a;
  undefined1 local_639;
  anon_class_16_2_fd512ddd_for_cb local_638;
  allocator<char> local_621;
  string local_620;
  Sub *local_600;
  Sub local_5f8;
  iterator local_540;
  size_type local_538;
  undefined1 local_530 [8];
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  subs;
  string_view file_default_instances_code;
  basic_string_view<char,_std::char_traits<char>_> local_4f8;
  undefined1 local_4e1;
  undefined1 local_4e0 [31];
  allocator<char> local_4c1;
  string local_4c0;
  anon_class_24_3_1ecdd903_for_cb local_4a0;
  allocator<char> local_481;
  string local_480;
  Sub *local_460;
  Sub local_458;
  Sub local_3a0;
  iterator local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2d8;
  undefined1 local_2c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_290;
  undefined1 local_279;
  undefined1 local_278 [8];
  string local_270;
  undefined8 local_250;
  Sub local_248;
  iterator local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_180;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  undefined1 local_139;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_138;
  allocator<char> local_119;
  string local_118;
  undefined8 local_f8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  undefined1 local_18 [8];
  Printer *p_local;
  FileGenerator *this_local;
  
  local_18 = (undefined1  [8])p;
  p_local = (Printer *)this;
  bVar2 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          ::empty(&this->enum_generators_);
  auVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_168,
               "\n      static constexpr const ::_pb::EnumDescriptor *$nonnull$ *$nullable$\n          $file_level_enum_descriptors$ = nullptr;\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_168._M_len,local_168._M_str);
  }
  else {
    local_139 = 1;
    local_f8 = &local_f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"len",&local_119);
    local_138._M_allocated_capacity =
         std::
         vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
         ::size(&this->enum_generators_);
    io::Printer::Sub::Sub<unsigned_long>(&local_f0,&local_118,&local_138._M_allocated_capacity);
    local_139 = 0;
    local_38 = &local_f0;
    local_30 = 1;
    v_05._M_len = 1;
    v_05._M_array = local_38;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_28._M_local_buf,v_05);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_150,
               "\n      //~ Default initialized to null, but set to non-null values before use.\n      static const ::_pb::EnumDescriptor* $nonnull$\n          $file_level_enum_descriptors$[$len$];\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_28._M_allocated_capacity,local_28._8_8_,
                      local_150._M_len,local_150._M_str);
    local_16b8 = (Sub *)&local_38;
    do {
      local_16b8 = local_16b8 + -1;
      io::Printer::Sub::~Sub(local_16b8);
    } while (local_16b8 != &local_f0);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  bVar2 = HasGenericServices(this->file_,&this->options_);
  if ((bVar2) && (iVar3 = FileDescriptor::service_count(this->file_), auVar1 = local_18, 0 < iVar3))
  {
    local_279 = 1;
    local_250 = &local_248;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"len",(allocator<char> *)(local_278 + 7));
    local_278._0_4_ = FileDescriptor::service_count(this->file_);
    io::Printer::Sub::Sub<int>(&local_248,&local_270,(int *)local_278);
    local_279 = 0;
    local_190 = &local_248;
    local_188 = 1;
    v_04._M_len = 1;
    v_04._M_array = local_190;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_180._M_local_buf,v_04);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&local_290,
               "\n      //~ Default initialized to null, but set to non-null values before use.\n      static const ::_pb::ServiceDescriptor* $nonnull$\n          $file_level_service_descriptors$[$len$];\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_180._M_allocated_capacity,local_180._8_8_,
                      local_290._M_allocated_capacity,local_290._8_8_);
    local_1718 = (Sub *)&local_190;
    do {
      local_1718 = local_1718 + -1;
      io::Printer::Sub::~Sub(local_1718);
    } while (local_1718 != &local_248);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)(local_278 + 7));
  }
  else {
    auVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a8,
               "\n      static constexpr const ::_pb::ServiceDescriptor *$nonnull$ *$nullable$\n          $file_level_service_descriptors$ = nullptr;\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_2a8._M_len,local_2a8._M_str);
  }
  bVar2 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::empty(&this->message_generators_);
  auVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_680,
               "\n      const ::uint32_t $tablename$::offsets[1] = {};\n      static constexpr ::_pbi::MigrationSchema* $nullable$ schemas = nullptr;\n      static constexpr ::_pb::Message* $nonnull$ const* $nullable$\n          file_default_instances = nullptr;\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_680._M_len,local_680._M_str);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8);
    __n = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::size(&this->message_generators_);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8,__n);
    auVar1 = local_18;
    local_4e1 = '\x01';
    local_460 = &local_458;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"offsets",&local_481);
    local_4a0.offsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8;
    local_4a0.p = (Printer **)local_18;
    local_4a0.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__2>
              (&local_458,&local_480,&local_4a0);
    local_460 = &local_3a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"schemas",&local_4c1);
    local_4e0._8_8_ = local_18;
    local_4e0._16_8_ = local_2c8;
    local_4e0._0_8_ = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__3>
              (&local_3a0,&local_4c0,(anon_class_24_3_c82d5fe3_for_cb *)local_4e0);
    local_4e1 = '\0';
    local_2e8 = &local_458;
    local_2e0 = 2;
    v_03._M_len = 2;
    v_03._M_array = local_2e8;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_2d8._M_local_buf,v_03);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4f8,
               "\n          const ::uint32_t\n              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n                  protodesc_cold) = {\n                  $offsets$,\n          };\n\n          static const ::_pbi::MigrationSchema\n              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {\n                  $schemas$,\n          };\n        "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_2d8._M_allocated_capacity,local_2d8._8_8_,
                      local_4f8._M_len,local_4f8._M_str);
    local_1788 = (Sub *)&local_2e8;
    do {
      local_1788 = local_1788 + -1;
      io::Printer::Sub::~Sub(local_1788);
    } while (local_1788 != &local_458);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    subs.
    super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x74;
    bVar2 = UsingImplicitWeakDescriptor(this->file_,&this->options_);
    if (!bVar2) {
      local_639 = 1;
      local_600 = &local_5f8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"defaults",&local_621)
      ;
      local_638.p = (Printer **)local_18;
      local_638.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__4>
                (&local_5f8,&local_620,&local_638);
      local_639 = 0;
      local_540 = &local_5f8;
      local_538 = 1;
      std::allocator<google::protobuf::io::Printer::Sub>::allocator(&local_63a);
      __l._M_len = local_538;
      __l._M_array = local_540;
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)local_530,__l,&local_63a);
      std::allocator<google::protobuf::io::Printer::Sub>::~allocator(&local_63a);
      local_17b8 = (Sub *)&local_540;
      do {
        local_17b8 = local_17b8 + -1;
        io::Printer::Sub::~Sub(local_17b8);
      } while (local_17b8 != &local_5f8);
      std::__cxx11::string::~string((string *)&local_620);
      std::allocator<char>::~allocator(&local_621);
      auVar1 = local_18;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
                ((Span<google::protobuf::io::Printer::Sub_const> *)&local_650,
                 (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                  *)local_530);
      local_668 = subs.
                  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcStack_660 = 
      "\n      static const ::_pb::Message* $nonnull$ const file_default_instances[] = {\n          $defaults$,\n      };\n    "
      ;
      io::Printer::SourceLocation::current();
      io::Printer::Emit((Printer *)auVar1,local_650,local_648,local_668,pcStack_660);
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 *)local_530);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8);
  }
  __return_storage_ptr__ = (FileDescriptorProto *)((long)&file_data.field_2 + 8);
  StripSourceRetentionOptions(__return_storage_ptr__,this->file_,false);
  std::__cxx11::string::string((string *)(desc_name.field_2._M_local_buf + 8));
  MessageLite::SerializeToString
            ((MessageLite *)__return_storage_ptr__,(string *)(desc_name.field_2._M_local_buf + 8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_7d0,
             "descriptor_table_protodef");
  sVar8._M_str = (char *)this->file_;
  sVar8._M_len = local_7d0._8_8_;
  UniqueName_abi_cxx11_
            ((string *)local_7c0,(cpp *)local_7d0._0_8_,sVar8,(FileDescriptor *)&this->options_,
             in_R9);
  auVar1 = local_18;
  local_9d1 = 1;
  local_968 = &local_960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"desc_name",&local_989);
  io::Printer::Sub::Sub<std::__cxx11::string&>
            (&local_960,&local_988,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c0);
  local_968 = &local_8a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b0,"encoded_file_proto",&local_9b1);
  local_9d0.p = (Printer **)local_18;
  local_9d0.file_data = (string *)((long)&desc_name.field_2 + 8);
  local_9d0.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__5>
            (&local_8a8,&local_9b0,&local_9d0);
  local_9d1 = 0;
  local_7f0 = &local_960;
  local_7e8 = 2;
  v_02._M_len = 2;
  v_02._M_array = local_7f0;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_7e0._M_local_buf,v_02);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_9e8,
             "\n        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n            protodesc_cold) = {\n            $encoded_file_proto$,\n        };\n      "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)auVar1,local_7e0._M_allocated_capacity,local_7e0._8_8_,
                    local_9e8._M_len,local_9e8._M_str);
  local_1860 = (Sub *)&local_7f0;
  do {
    local_1860 = local_1860 + -1;
    io::Printer::Sub::~Sub(local_1860);
  } while (local_1860 != &local_960);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator(&local_989);
  CrossFileReferences::CrossFileReferences((CrossFileReferences *)&num_deps);
  GetCrossFileReferencesForFile(this,this->file_,(CrossFileReferences *)&num_deps);
  sVar4 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
          ::size((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                  *)&refs.weak_default_instances.
                     super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                     .
                     super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                     .tree_.size_);
  sVar5 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
          ::size((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                  *)&refs.strong_reflection_files.
                     super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                     .
                     super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                     .tree_.size_);
  auVar1 = local_18;
  local_a40 = (undefined1  [8])(sVar4 + sVar5);
  if (local_a40 != (undefined1  [8])0x0) {
    local_c41 = '\x01';
    local_bd8 = &local_bd0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_bf8,"len",&local_bf9);
    io::Printer::Sub::Sub<unsigned_long&>(&local_bd0,&local_bf8,(unsigned_long *)local_a40);
    local_bd8 = local_b18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c20,"deps",&local_c21);
    local_c40.refs = (CrossFileReferences *)&num_deps;
    local_c40.p = (Printer **)local_18;
    local_c40.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__6>
              ((Sub *)local_b18,&local_c20,&local_c40);
    local_c41 = '\0';
    local_a60 = &local_bd0;
    local_a58 = 2;
    v_01._M_len = 2;
    v_01._M_array = local_a60;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_a50._M_local_buf,v_01);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c58,
               "\n          static const ::_pbi::DescriptorTable* $nonnull$ const\n              $desc_table$_deps[$len$] = {\n                  $deps$,\n          };\n        "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_a50._M_allocated_capacity,local_a50._8_8_,_auStack_c58
                      ,local_c50);
    local_18a8 = (Sub *)&local_a60;
    do {
      local_18a8 = local_18a8 + -1;
      io::Printer::Sub::~Sub(local_18a8);
    } while (local_18a8 != &local_bd0);
    std::__cxx11::string::~string((string *)&local_c20);
    std::allocator<char>::~allocator(&local_c21);
    std::__cxx11::string::~string((string *)&local_bf8);
    std::allocator<char>::~allocator(&local_bf9);
  }
  auVar1 = local_18;
  local_c5b = 0;
  local_1289 = 1;
  local_10d8 = &local_10d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10f8,"eager",&local_10f9);
  local_1108 = "false";
  if ((local_c5b & 1) != 0) {
    local_1108 = "true";
  }
  io::Printer::Sub::Sub<char_const*>(&local_10d0,&local_10f8,&local_1108);
  local_10d8 = &local_1018;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1128,"file_proto_len",&local_1129);
  if (((this->options_).strip_nonfunctional_codegen & 1U) == 0) {
    local_1930 = std::__cxx11::string::size();
  }
  else {
    local_1930 = 0;
  }
  local_1138 = local_1930;
  io::Printer::Sub::Sub<unsigned_long>(&local_1018,&local_1128,&local_1138);
  local_10d8 = &local_f60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1158,"proto_name",&local_1159)
  ;
  io::Printer::Sub::Sub<std::__cxx11::string&>
            (&local_f60,&local_1158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c0);
  local_10d8 = &local_ea8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1180,"deps_ptr",&local_1181);
  this_00 = local_18;
  local_11aa = 0;
  if (local_a40 == (undefined1  [8])0x0) {
    std::allocator<char>::allocator();
    local_11aa = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_11a8,"nullptr",&local_11a9);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1200,"desc_table");
    sVar8 = io::Printer::LookupVar((Printer *)this_00,local_1200);
    local_11e8 = sVar8._M_str;
    pAVar6 = (AlphaNum *)sVar8._M_len;
    local_11f0 = pAVar6;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_11e0,sVar8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1230,"_deps");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_11a8,(lts_20250127 *)&local_11e0,&local_1230,pAVar6);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_ea8,&local_1180,&local_11a8);
  local_10d8 = &local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1250,"num_deps",&local_1251);
  io::Printer::Sub::Sub<unsigned_long&>(&local_df0,&local_1250,(unsigned_long *)local_a40);
  local_10d8 = &local_d38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1278,"num_msgs",&local_1279);
  local_1288 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::size(&this->message_generators_);
  io::Printer::Sub::Sub<unsigned_long>(&local_d38,&local_1278,&local_1288);
  local_1289 = 0;
  local_c80 = &local_10d0;
  local_c78 = 6;
  v_00._M_len = 6;
  v_00._M_array = local_c80;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_c70._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_12a0,
             "\n        static ::absl::once_flag $desc_table$_once;\n        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {\n            false,\n            $eager$,\n            $file_proto_len$,\n            $proto_name$,\n            \"$filename$\",\n            &$desc_table$_once,\n            $deps_ptr$,\n            $num_deps$,\n            $num_msgs$,\n            schemas,\n            file_default_instances,\n            $tablename$::offsets,\n            $file_level_enum_descriptors$,\n            $file_level_service_descriptors$,\n        };\n      "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)auVar1,local_c70._M_allocated_capacity,local_c70._8_8_,
                    local_12a0._M_len,local_12a0._M_str);
  local_1998 = (Sub *)&local_c80;
  do {
    local_1998 = local_1998 + -1;
    io::Printer::Sub::~Sub(local_1998);
  } while (local_1998 != &local_10d0);
  std::__cxx11::string::~string((string *)&local_1278);
  std::allocator<char>::~allocator(&local_1279);
  std::__cxx11::string::~string((string *)&local_1250);
  std::allocator<char>::~allocator(&local_1251);
  std::__cxx11::string::~string((string *)&local_11a8);
  if ((local_11aa & 1) != 0) {
    std::allocator<char>::~allocator(&local_11a9);
  }
  std::__cxx11::string::~string((string *)&local_1180);
  std::allocator<char>::~allocator(&local_1181);
  std::__cxx11::string::~string((string *)&local_1158);
  std::allocator<char>::~allocator(&local_1159);
  std::__cxx11::string::~string((string *)&local_1128);
  std::allocator<char>::~allocator(&local_1129);
  std::__cxx11::string::~string((string *)&local_10f8);
  std::allocator<char>::~allocator(&local_10f9);
  sVar8 = FileDescriptor::name(this->file_);
  filename._M_str = sVar8._M_str;
  filename._M_len = (size_t)filename._M_str;
  bVar2 = protobuf::internal::cpp::IsLazilyInitializedFile((cpp *)sVar8._M_len,filename);
  if (!bVar2) {
    bVar2 = UsingImplicitWeakDescriptor(this->file_,&this->options_);
    if (bVar2) {
      GetMessagesToPinGloballyForWeakDescriptors
                ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)&__begin5,this->file_,&this->options_);
      __end5 = std::
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::begin((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                        *)&__begin5);
      pinned = (Descriptor *)
               std::
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::end((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)&__begin5);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                                         *)&pinned), bVar2) {
        ppDVar7 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                  ::operator*(&__end5);
        local_1328.pinned = *ppDVar7;
        local_1328.this = this;
        local_12f0 = local_1328.pinned;
        absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>::
        AnyInvocable<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0,void>
                  ((AnyInvocable<void(google::protobuf::io::Printer*)> *)&local_1318,&local_1328);
        std::
        vector<absl::lts_20250127::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20250127::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        ::push_back(this->static_initializers_ + 1,&local_1318);
        absl::lts_20250127::AnyInvocable<void_(google::protobuf::io::Printer_*)>::~AnyInvocable
                  (&local_1318);
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
        ::operator++(&__end5);
      }
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::~vector((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 *)&__begin5);
    }
    absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>::
    AnyInvocable<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__1,void>
              ((AnyInvocable<void(google::protobuf::io::Printer*)> *)&local_1348,
               (anon_class_1_0_00000001 *)
               ((long)&ns.name_stack_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<absl::lts_20250127::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20250127::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
    ::push_back(this->static_initializers_ + 1,&local_1348);
    absl::lts_20250127::AnyInvocable<void_(google::protobuf::io::Printer_*)>::~AnyInvocable
              (&local_1348);
  }
  bVar2 = IsFileDescriptorProto(this->file_,&this->options_);
  auVar1 = local_18;
  if (bVar2) {
    io::Printer::SourceLocation::current();
    NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_1378,auVar1);
    sVar8 = ProtobufNamespace(&this->options_);
    local_13f0._8_8_ = sVar8._M_str;
    pAVar6 = (AlphaNum *)sVar8._M_len;
    local_13f0._M_allocated_capacity = (size_type)pAVar6;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_13e0,sVar8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1420,"::internal");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_13b0,(lts_20250127 *)&local_13e0,&local_1420,pAVar6);
    local_1390 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_13b0);
    io::Printer::SourceLocation::current();
    NamespaceOpener::ChangeTo((NamespaceOpener *)local_1378,local_1390._0_8_,local_1390._8_8_);
    std::__cxx11::string::~string((string *)&local_13b0);
    auVar1 = local_18;
    local_1679 = 1;
    local_15c0 = &local_15b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_15e0,"dummy",&local_15e1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1618,"dynamic_init_dummy");
    name._M_str = (char *)this->file_;
    name._M_len = (size_t)local_1618._M_str;
    UniqueName_abi_cxx11_
              (&local_1608,(cpp *)local_1618._M_len,name,(FileDescriptor *)&this->options_,in_R9);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_15b8,&local_15e0,&local_1608);
    local_15c0 = &local_1500;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1638,"initializers",&local_1639);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1670,"\n");
    separator._M_str = (char *)&local_1678;
    separator._M_len = (size_t)local_1670._M_str;
    local_1678 = this;
    absl::lts_20250127::
    StrJoin<std::vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__7>
              (&local_1660,(lts_20250127 *)&this->message_generators_,
               (vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                *)local_1670._M_len,separator,(anon_class_8_1_8991fb9c *)in_R9);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_1500,&local_1638,&local_1660);
    local_1679 = 0;
    local_1448 = &local_15b8;
    local_1440 = 2;
    v._M_len = 2;
    v._M_array = local_1448;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_1438._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1690,
               "\n          //~ Emit wants an indented line, so give it a comment to strip.\n#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {\n            $initializers$;\n          }\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          static std::true_type $dummy${\n              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};\n#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n        "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_1438._M_allocated_capacity,local_1438._8_8_,
                      local_1690._M_len,local_1690._M_str);
    local_1a48 = (Sub *)&local_1448;
    do {
      local_1a48 = local_1a48 + -1;
      io::Printer::Sub::~Sub(local_1a48);
    } while (local_1a48 != &local_15b8);
    std::__cxx11::string::~string((string *)&local_1660);
    std::__cxx11::string::~string((string *)&local_1638);
    std::allocator<char>::~allocator(&local_1639);
    std::__cxx11::string::~string((string *)&local_1608);
    std::__cxx11::string::~string((string *)&local_15e0);
    std::allocator<char>::~allocator(&local_15e1);
    NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_1378);
  }
  CrossFileReferences::~CrossFileReferences((CrossFileReferences *)&num_deps);
  std::__cxx11::string::~string((string *)local_7c0);
  std::__cxx11::string::~string((string *)(desc_name.field_2._M_local_buf + 8));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)((long)&file_data.field_2 + 8));
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* p) {
  if (!enum_generators_.empty()) {
    p->Emit({{"len", enum_generators_.size()}}, R"cc(
      //~ Default initialized to null, but set to non-null values before use.
      static const ::_pb::EnumDescriptor* $nonnull$
          $file_level_enum_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::EnumDescriptor *$nonnull$ *$nullable$
          $file_level_enum_descriptors$ = nullptr;
    )cc");
  }

  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    p->Emit({{"len", file_->service_count()}}, R"cc(
      //~ Default initialized to null, but set to non-null values before use.
      static const ::_pb::ServiceDescriptor* $nonnull$
          $file_level_service_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::ServiceDescriptor *$nonnull$ *$nullable$
          $file_level_service_descriptors$ = nullptr;
    )cc");
  }

  if (!message_generators_.empty()) {
    std::vector<size_t> offsets;
    offsets.reserve(message_generators_.size());

    p->Emit(
        {
            {"offsets",
             [&] {
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 offsets.push_back(message_generators_[i]->GenerateOffsets(p));
               }
             }},
            {"schemas",
             [&] {
               int offset = 0;
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 message_generators_[i]->GenerateSchema(p, offset);
                 offset += offsets[i];
               }
             }},
        },
        R"cc(
          const ::uint32_t
              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
                  protodesc_cold) = {
                  $offsets$,
          };

          static const ::_pbi::MigrationSchema
              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {
                  $schemas$,
          };
        )cc");
    constexpr absl::string_view file_default_instances_code = R"cc(
      static const ::_pb::Message* $nonnull$ const file_default_instances[] = {
          $defaults$,
      };
    )cc";
    if (!UsingImplicitWeakDescriptor(file_, options_)) {
      std::vector<Sub> subs = {
          {"defaults", [&] {
             for (auto& gen : message_generators_) {
               p->Emit(
                   {
                       {"ns", Namespace(gen->descriptor(), options_)},
                       {"class", ClassName(gen->descriptor())},
                   },
                   R"cc(
                     &$ns$::_$class$_default_instance_._instance,
                   )cc");
             }
           }}};
      p->Emit(subs, file_default_instances_code);
    }
  } else {
    // Ee still need these symbols to exist.
    //
    // MSVC doesn't like empty arrays, so we add a dummy.
    p->Emit(R"cc(
      const ::uint32_t $tablename$::offsets[1] = {};
      static constexpr ::_pbi::MigrationSchema* $nullable$ schemas = nullptr;
      static constexpr ::_pb::Message* $nonnull$ const* $nullable$
          file_default_instances = nullptr;
    )cc");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.

  FileDescriptorProto file_proto = StripSourceRetentionOptions(*file_);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  auto desc_name = UniqueName("descriptor_table_protodef", file_, options_);
  p->Emit(
      {{"desc_name", desc_name},
       {"encoded_file_proto",
        [&] {
          if (options_.strip_nonfunctional_codegen) {
            p->Emit(R"cc("")cc");
            return;
          }

          absl::string_view data = file_data;
          if (data.size() <= 65535) {
            static constexpr size_t kBytesPerLine = 40;
            while (!data.empty()) {
              auto to_write = std::min(kBytesPerLine, data.size());
              auto chunk = data.substr(0, to_write);
              data = data.substr(to_write);

              p->Emit({{"text", EscapeTrigraphs(absl::CEscape(chunk))}}, R"cc(
                "$text$"
              )cc");
            }
            return;
          }

          // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
          // 65535 bytes in length". Declare a static array of chars rather than
          // use a string literal. Only write 25 bytes per line.
          static constexpr size_t kBytesPerLine = 25;
          while (!data.empty()) {
            auto to_write = std::min(kBytesPerLine, data.size());
            auto chunk = data.substr(0, to_write);
            data = data.substr(to_write);

            std::string line;
            for (char c : chunk) {
              absl::StrAppend(&line, "'",
                              absl::CEscape(absl::string_view(&c, 1)), "', ");
            }

            p->Emit({{"line", line}}, R"cc(
              $line$
            )cc");
          }
        }}},
      R"cc(
        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
            protodesc_cold) = {
            $encoded_file_proto$,
        };
      )cc");

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  size_t num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    p->Emit(
        {
            {"len", num_deps},
            {"deps",
             [&] {
               for (auto dep : refs.strong_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
               for (auto dep : refs.weak_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
             }},
        },
        R"cc(
          static const ::_pbi::DescriptorTable* $nonnull$ const
              $desc_table$_deps[$len$] = {
                  $deps$,
          };
        )cc");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  p->Emit(
      {
          {"eager", eager ? "true" : "false"},
          {"file_proto_len",
           options_.strip_nonfunctional_codegen ? 0 : file_data.size()},
          {"proto_name", desc_name},
          {"deps_ptr", num_deps == 0
                           ? "nullptr"
                           : absl::StrCat(p->LookupVar("desc_table"), "_deps")},
          {"num_deps", num_deps},
          {"num_msgs", message_generators_.size()},
      },
      R"cc(
        static ::absl::once_flag $desc_table$_once;
        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {
            false,
            $eager$,
            $file_proto_len$,
            $proto_name$,
            "$filename$",
            &$desc_table$_once,
            $deps_ptr$,
            $num_deps$,
            $num_msgs$,
            schemas,
            file_default_instances,
            $tablename$::offsets,
            $file_level_enum_descriptors$,
            $file_level_service_descriptors$,
        };
      )cc");

  // For descriptor.proto and cpp_features.proto we want to avoid doing any
  // dynamic initialization, because in some situations that would otherwise
  // pull in a lot of unnecessary code that can't be stripped by --gc-sections.
  // Descriptor initialization will still be performed lazily when it's needed.
  if (!IsLazilyInitializedFile(file_->name())) {
    if (UsingImplicitWeakDescriptor(file_, options_)) {
      for (auto* pinned :
           GetMessagesToPinGloballyForWeakDescriptors(file_, options_)) {
        static_initializers_[kInitPriority102].push_back([this,
                                                          pinned](auto* p) {
          p->Emit({{"pin", StrongReferenceToType(pinned, options_)}},
                  R"cc(
                    $pin$,
                  )cc");
        });
      }
    }
    static_initializers_[kInitPriority102].push_back([](auto* p) {
      p->Emit(R"cc(
        ::_pbi::AddDescriptors(&$desc_table$),
      )cc");
    });
  }

  // However, we must provide a way to force initialize the default instances
  // of FileDescriptorProto which will be used during registration of other
  // files.
  if (IsFileDescriptorProto(file_, options_)) {
    NamespaceOpener ns(p);
    ns.ChangeTo(absl::StrCat(ProtobufNamespace(options_), "::internal"));
    p->Emit(
        {{"dummy", UniqueName("dynamic_init_dummy", file_, options_)},
         {"initializers", absl::StrJoin(message_generators_, "\n",
                                        [&](std::string* out, const auto& gen) {
                                          absl::StrAppend(
                                              out,
                                              DefaultInstanceName(
                                                  gen->descriptor(), options_),
                                              ".Init();");
                                        })}},
        R"cc(
          //~ Emit wants an indented line, so give it a comment to strip.
#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {
            $initializers$;
          }
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          static std::true_type $dummy${
              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};
#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
        )cc");
  }
}